

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::run_step(Dialog *this,bool block)

{
  ulong uVar1;
  ALLEGRO_MOUSE_EVENT *event_00;
  byte in_SIL;
  Dialog *in_RDI;
  ALLEGRO_EVENT event;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Dialog *in_stack_ffffffffffffffb0;
  
  if ((in_SIL & 1) != 0) {
    al_wait_for_event(in_RDI->event_queue,0);
  }
  while (uVar1 = al_get_next_event(in_RDI->event_queue,&stack0xffffffffffffffa8), (uVar1 & 1) != 0)
  {
    event_00 = (ALLEGRO_MOUSE_EVENT *)(ulong)(in_stack_ffffffffffffffa8 - 0xb);
    switch(event_00) {
    case (ALLEGRO_MOUSE_EVENT *)0x0:
      on_key_down(in_RDI,(ALLEGRO_KEYBOARD_EVENT *)event_00);
      break;
    default:
      if (in_RDI->event_handler != (EventHandler *)0x0) {
        (**(code **)(*(long *)in_RDI->event_handler + 0x10))
                  (in_RDI->event_handler,&stack0xffffffffffffffa8);
      }
      break;
    case (ALLEGRO_MOUSE_EVENT *)0x9:
      on_mouse_axes(in_stack_ffffffffffffffb0,
                    (ALLEGRO_MOUSE_EVENT *)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      break;
    case (ALLEGRO_MOUSE_EVENT *)0xa:
      on_mouse_button_down(in_RDI,event_00);
      break;
    case (ALLEGRO_MOUSE_EVENT *)0xb:
      on_mouse_button_up(in_RDI,event_00);
      break;
    case (ALLEGRO_MOUSE_EVENT *)0x1d:
      request_draw(in_RDI);
      break;
    case (ALLEGRO_MOUSE_EVENT *)0x1f:
      request_quit(in_RDI);
    }
  }
  return;
}

Assistant:

void Dialog::run_step(bool block)
{
   ALLEGRO_EVENT event;

   if (block) {
      al_wait_for_event(event_queue, NULL);
   }

   while (al_get_next_event(event_queue, &event)) {
      switch (event.type) {
         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            this->request_quit();
            break;

         case ALLEGRO_EVENT_KEY_CHAR:
            on_key_down(event.keyboard);
            break;

         case ALLEGRO_EVENT_MOUSE_AXES:
            on_mouse_axes(event.mouse);
            break;

         case ALLEGRO_EVENT_MOUSE_BUTTON_DOWN:
            on_mouse_button_down(event.mouse);
            break;

         case ALLEGRO_EVENT_MOUSE_BUTTON_UP:
            on_mouse_button_up(event.mouse);
            break;

         case ALLEGRO_EVENT_DISPLAY_EXPOSE:
            this->request_draw();
            break;

         default:
            if (event_handler) {
               event_handler->handle_event(event);
            }
            break;
      }
   }
}